

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel.cc
# Opt level: O0

void MULTILABEL::print_update(vw *all,bool is_test,example *ec)

{
  ulong uVar1;
  size_t sVar2;
  ostream *poVar3;
  uint *puVar4;
  long in_RDX;
  byte in_SIL;
  long *in_RDI;
  double dVar5;
  size_t i_1;
  stringstream pred_string;
  size_t i;
  stringstream label_string;
  string local_388 [32];
  string local_368 [32];
  ulong local_348;
  stringstream local_340 [16];
  float in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd7;
  size_t in_stack_fffffffffffffcd8;
  string *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  size_t in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcff;
  shared_data *in_stack_fffffffffffffd00;
  size_t local_1b8;
  stringstream local_1a0 [16];
  ostream local_190;
  long local_18;
  byte local_9;
  long *local_8;
  
  local_9 = in_SIL & 1;
  local_18 = in_RDX;
  local_8 = in_RDI;
  dVar5 = shared_data::weighted_examples((shared_data *)*in_RDI);
  if ((((double)*(float *)(*local_8 + 0x50) <= dVar5) &&
      ((*(byte *)((long)local_8 + 0x3439) & 1) == 0)) &&
     ((*(byte *)((long)local_8 + 0x9c) & 1) == 0)) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    if ((local_9 & 1) == 0) {
      for (local_1b8 = 0;
          sVar2 = v_array<unsigned_int>::size((v_array<unsigned_int> *)(local_18 + 0x6828)),
          local_1b8 < sVar2; local_1b8 = local_1b8 + 1) {
        poVar3 = std::operator<<(&local_190," ");
        puVar4 = v_array<unsigned_int>::operator[]
                           ((v_array<unsigned_int> *)(local_18 + 0x6828),local_1b8);
        std::ostream::operator<<(poVar3,*puVar4);
      }
    }
    else {
      std::operator<<(&local_190," unknown");
    }
    std::__cxx11::stringstream::stringstream(local_340);
    for (local_348 = 0; uVar1 = local_348,
        sVar2 = v_array<unsigned_int>::size((v_array<unsigned_int> *)(local_18 + 0x6850)),
        uVar1 < sVar2; local_348 = local_348 + 1) {
      poVar3 = std::operator<<((ostream *)&stack0xfffffffffffffcd0," ");
      puVar4 = v_array<unsigned_int>::operator[]
                         ((v_array<unsigned_int> *)(local_18 + 0x6850),local_348);
      std::ostream::operator<<(poVar3,*puVar4);
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::str();
    shared_data::print_update
              (in_stack_fffffffffffffd00,(bool)in_stack_fffffffffffffcff,in_stack_fffffffffffffcf0,
               in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,
               (bool)in_stack_fffffffffffffcd7,in_stack_fffffffffffffcd0);
    std::__cxx11::string::~string(local_388);
    std::__cxx11::string::~string(local_368);
    std::__cxx11::stringstream::~stringstream(local_340);
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  return;
}

Assistant:

void print_update(vw& all, bool is_test, example& ec)
{
  if (all.sd->weighted_examples() >= all.sd->dump_interval && !all.quiet && !all.bfgs)
  {
    stringstream label_string;
    if (is_test)
      label_string << " unknown";
    else
      for (size_t i = 0; i < ec.l.multilabels.label_v.size(); i++) label_string << " " << ec.l.multilabels.label_v[i];

    stringstream pred_string;
    for (size_t i = 0; i < ec.pred.multilabels.label_v.size(); i++)
      pred_string << " " << ec.pred.multilabels.label_v[i];

    all.sd->print_update(all.holdout_set_off, all.current_pass, label_string.str(), pred_string.str(), ec.num_features,
        all.progress_add, all.progress_arg);
  }
}